

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_AigerWriteUnsigned(Vec_Str_t *vStr,uint x)

{
  undefined4 local_14;
  uchar ch;
  uint x_local;
  Vec_Str_t *vStr_local;
  
  for (local_14 = x; (local_14 & 0xffffff80) != 0; local_14 = local_14 >> 7) {
    Vec_StrPush(vStr,(byte)local_14 & 0x7f | 0x80);
  }
  Vec_StrPush(vStr,(byte)local_14);
  return;
}

Assistant:

static inline void Gia_AigerWriteUnsigned( Vec_Str_t * vStr, unsigned x )
{
    unsigned char ch;
    while (x & ~0x7f)
    {
        ch = (x & 0x7f) | 0x80;
        Vec_StrPush( vStr, ch );
        x >>= 7;
    }
    ch = x;
    Vec_StrPush( vStr, ch );
}